

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

Size __thiscall CS248::Face::degree(Face *this)

{
  bool bVar1;
  pointer this_00;
  HalfedgeIter *pHVar2;
  _List_iterator<CS248::Halfedge> *in_RDI;
  HalfedgeIter h;
  Size d;
  _Self local_18;
  Size local_10;
  
  local_10 = 0;
  local_18._M_node = in_RDI[0x15]._M_node;
  do {
    local_10 = local_10 + 1;
    this_00 = std::_List_iterator<CS248::Halfedge>::operator->(in_RDI);
    pHVar2 = Halfedge::next(this_00);
    local_18._M_node = pHVar2->_M_node;
    bVar1 = std::operator!=(&local_18,in_RDI + 0x15);
  } while (bVar1);
  return local_10;
}

Assistant:

Size degree() const {
    Size d = 0;  // degree

    // walk around the face
    HalfedgeIter h = _halfedge;
    do {
      d++;  // increment the degree
      h = h->next();
    } while (h != _halfedge);  // done walking around the face

    return d;
  }